

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void __thiscall
duckdb::ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_>::ModeRm
          (ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *this,idx_t frame)

{
  __buckets_ptr pp_Var1;
  uint *puVar2;
  mapped_type *pmVar3;
  unordered_map<unsigned_int,_duckdb::ModeAttr,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>_>
  *in_RDI;
  size_t old_count;
  mapped_type *attr;
  uint *key;
  key_type *in_stack_ffffffffffffffc8;
  idx_t in_stack_ffffffffffffffd8;
  ModeState<unsigned_int,_duckdb::ModeStandard<unsigned_int>_> *in_stack_ffffffffffffffe0;
  
  puVar2 = GetCell(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pmVar3 = ::std::
           unordered_map<unsigned_int,_duckdb::ModeAttr,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_duckdb::ModeAttr>_>_>
           ::operator[](in_RDI,in_stack_ffffffffffffffc8);
  pp_Var1 = (__buckets_ptr)pmVar3->count;
  (in_RDI->_M_h)._M_rehash_policy._M_next_resize =
       (in_RDI->_M_h)._M_rehash_policy._M_next_resize - (ulong)(pp_Var1 == (__buckets_ptr)0x1);
  pmVar3->count = pmVar3->count - 1;
  if ((in_RDI[1]._M_h._M_buckets == pp_Var1) &&
     (*puVar2 == **(uint **)&(in_RDI->_M_h)._M_rehash_policy)) {
    *(undefined1 *)&(in_RDI->_M_h)._M_single_bucket = 0;
  }
  return;
}

Assistant:

void ModeRm(idx_t frame) {
		const auto &key = GetCell(frame);
		auto &attr = (*frequency_map)[key];
		auto old_count = attr.count;
		nonzero -= size_t(old_count == 1);

		attr.count -= 1;
		if (count == old_count && key == *mode) {
			valid = false;
		}
	}